

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

CService * MaybeFlipIPv6toCJDNS(CService *__return_storage_ptr__,CService *service)

{
  long lVar1;
  bool bVar2;
  CService *pCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::CService(__return_storage_ptr__,service);
  if ((__return_storage_ptr__->super_CNetAddr).m_net == NET_IPV6) {
    pCVar3 = __return_storage_ptr__;
    if (0x10 < (__return_storage_ptr__->super_CNetAddr).m_addr._size) {
      pCVar3 = (CService *)
               (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect;
    }
    if ((pCVar3->super_CNetAddr).m_addr._union.direct[0] == -4) {
      bVar2 = ReachableNets::Contains(&g_reachable_nets,NET_CJDNS);
      if (bVar2) {
        (__return_storage_ptr__->super_CNetAddr).m_net = NET_CJDNS;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService MaybeFlipIPv6toCJDNS(const CService& service)
{
    CService ret{service};
    if (ret.IsIPv6() && ret.HasCJDNSPrefix() && g_reachable_nets.Contains(NET_CJDNS)) {
        ret.m_net = NET_CJDNS;
    }
    return ret;
}